

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

bool jessilib::equalsi<char32_t,char16_t>
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> lhs,
               basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs)

{
  int iVar1;
  int iVar2;
  char16_t *pcVar3;
  size_t sVar4;
  long lVar5;
  wchar32 wVar6;
  size_t sVar7;
  
  pcVar3 = rhs._M_str;
  sVar4 = rhs._M_len;
  if (lhs._M_len != 0) {
    sVar7 = 0;
    do {
      if (sVar4 == 0) {
        return false;
      }
      wVar6 = (wchar32)(ushort)*pcVar3;
      lVar5 = 1;
      if (((sVar4 != 1) && ((wVar6 & 0xfc00U) == 0xd800)) &&
         (((ushort)pcVar3[1] & 0xfc00) == 0xdc00)) {
        wVar6 = (uint)(ushort)*pcVar3 * 0x400 + (uint)(ushort)pcVar3[1] + L'\xfca02400';
        lVar5 = 2;
      }
      if (lhs._M_str[sVar7] != wVar6) {
        iVar1 = jessilib::fold(lhs._M_str[sVar7]);
        iVar2 = jessilib::fold(wVar6);
        if (iVar1 != iVar2) {
          return false;
        }
      }
      pcVar3 = pcVar3 + lVar5;
      sVar4 = sVar4 - lVar5;
      sVar7 = sVar7 + 1;
    } while (lhs._M_len != sVar7);
  }
  return sVar4 == 0;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}